

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O3

int ecdh_sha2_nistp(LIBSSH2_SESSION *session,libssh2_curve_type type,uchar *data,size_t data_len,
                   uchar *public_key,size_t public_key_len,EC_KEY *private_key,
                   kmdhgGPshakex_state_t *exchange_state)

{
  uchar **data_00;
  void **ppvVar1;
  EVP_MD_CTX *pEVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  BIGNUM *pBVar6;
  LIBSSH2_HOSTKEY_METHOD *pLVar7;
  uchar *puVar8;
  uchar *puVar9;
  LIBSSH2_CRYPT_METHOD *pLVar10;
  _LIBSSH2_MAC_METHOD *p_Var11;
  LIBSSH2_COMP_METHOD *pLVar12;
  char *pcVar13;
  ulong uVar14;
  kmdhgGPshakex_state_t *pkVar15;
  long lVar16;
  uchar *puVar17;
  EVP_MD_CTX *pEVar18;
  size_t sVar19;
  size_t sVar20;
  size_t sVar21;
  EVP_MD_CTX *fingerprint_ctx;
  EVP_MD_CTX *hash;
  uchar *local_70;
  size_t local_68;
  libssh2_curve_type local_5c;
  size_t server_public_key_len;
  uchar *server_public_key;
  kmdhgGPshakex_state_t *local_48;
  void **local_40;
  size_t local_38;
  
  if (data_len < 5) {
    iVar3 = _libssh2_error(session,-10,"Host key data is too short");
    return iVar3;
  }
  local_48 = exchange_state;
  iVar3 = 0;
  local_5c = type;
  switch(exchange_state->state) {
  case libssh2_NB_state_idle:
    pBVar6 = BN_new();
    local_48->k = (BIGNUM *)pBVar6;
    local_48->state = libssh2_NB_state_created;
    break;
  default:
    goto switchD_001167a9_caseD_1;
  case libssh2_NB_state_created:
    break;
  case libssh2_NB_state_sent:
    goto switchD_001167a9_caseD_3;
  case libssh2_NB_state_sent2:
    goto switchD_001167a9_caseD_5;
  }
  local_70 = data + 1;
  hash = (EVP_MD_CTX *)data;
  local_68 = data_len;
  local_38 = public_key_len;
  iVar3 = _libssh2_copy_string
                    (session,(string_buf *)&hash,&session->server_hostkey,&server_public_key_len);
  if (iVar3 == 0) {
    session->server_hostkey_len = (uint32_t)server_public_key_len;
    iVar3 = _libssh2_md5_init(&fingerprint_ctx);
    if (iVar3 != 0) {
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                       (ulong)session->server_hostkey_len);
      EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey_md5,(uint *)0x0);
      EVP_MD_CTX_free(fingerprint_ctx);
    }
    session->server_hostkey_md5_valid = (uint)(iVar3 != 0);
    iVar3 = _libssh2_sha1_init(&fingerprint_ctx);
    if (iVar3 != 0) {
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                       (ulong)session->server_hostkey_len);
      EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey_sha1,(uint *)0x0);
      EVP_MD_CTX_free(fingerprint_ctx);
    }
    session->server_hostkey_sha1_valid = (uint)(iVar3 != 0);
    iVar3 = _libssh2_sha256_init(&fingerprint_ctx);
    if (iVar3 != 0) {
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                       (ulong)session->server_hostkey_len);
      EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey_sha256,(uint *)0x0);
      EVP_MD_CTX_free(fingerprint_ctx);
    }
    session->server_hostkey_sha256_valid = (uint)(iVar3 != 0);
    ppvVar1 = &session->server_hostkey_abstract;
    iVar3 = (*session->hostkey->init)
                      (session,session->server_hostkey,(ulong)session->server_hostkey_len,ppvVar1);
    if (iVar3 == 0) {
      iVar3 = _libssh2_get_string((string_buf *)&hash,&server_public_key,&server_public_key_len);
      pkVar15 = local_48;
      if (iVar3 == 0) {
        iVar3 = _libssh2_get_string((string_buf *)&hash,&local_48->h_sig,&local_48->h_sig_len);
        if (iVar3 != 0) {
          pcVar13 = "Unexpected ECDH server sig length";
          goto LAB_0011693a;
        }
        iVar3 = _libssh2_ecdh_gen_k(&pkVar15->k,private_key,
                                    (uchar *)CONCAT44(server_public_key._4_4_,(int)server_public_key
                                                     ),
                                    CONCAT44(server_public_key_len._4_4_,
                                             (uint32_t)server_public_key_len));
        if (iVar3 == 0) {
          iVar5 = BN_num_bits((BIGNUM *)pkVar15->k);
          iVar3 = iVar5 + 0xe;
          if (-1 < iVar5 + 7) {
            iVar3 = iVar5 + 7;
          }
          pkVar15->k_value_len = (long)((iVar3 >> 3) + 5);
          uVar4 = BN_num_bits((BIGNUM *)pkVar15->k);
          sVar21 = pkVar15->k_value_len;
          if ((uVar4 & 7) != 0) {
            sVar21 = sVar21 - 1;
            pkVar15->k_value_len = sVar21;
          }
          puVar8 = (uchar *)(*session->alloc)(sVar21,&session->abstract);
          pkVar15->k_value = puVar8;
          if (puVar8 == (uchar *)0x0) {
            pcVar13 = "Unable to allocate buffer for ECDH K";
            goto LAB_001167ff;
          }
          _libssh2_htonu32(puVar8,(int)pkVar15->k_value_len - 4);
          uVar4 = BN_num_bits((BIGNUM *)pkVar15->k);
          lVar16 = 4;
          if ((uVar4 & 7) == 0) {
            pkVar15->k_value[4] = '\0';
            lVar16 = 5;
          }
          BN_bn2bin((BIGNUM *)pkVar15->k,pkVar15->k_value + lVar16);
          if (local_5c == LIBSSH2_EC_CURVE_NISTP521) {
            pkVar15->exchange_hash = &fingerprint_ctx;
            local_40 = ppvVar1;
            _libssh2_sha512_init(&fingerprint_ctx);
            puVar9 = (session->local).banner;
            puVar8 = pkVar15->h_sig_comp;
            if (puVar9 == (uchar *)0x0) {
              _libssh2_htonu32(puVar8,0x16);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
              pcVar13 = "SSH-2.0-libssh2_1.11.0";
              sVar20 = 0x16;
              pEVar18 = (EVP_MD_CTX *)fingerprint_ctx;
            }
            else {
              sVar20 = strlen((char *)puVar9);
              _libssh2_htonu32(puVar8,(int)sVar20 - 2);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
              pEVar18 = (EVP_MD_CTX *)fingerprint_ctx;
              pcVar13 = (char *)(session->local).banner;
              sVar20 = strlen(pcVar13);
              sVar20 = sVar20 - 2;
            }
            EVP_DigestUpdate(pEVar18,pcVar13,sVar20);
            sVar20 = strlen((char *)(session->remote).banner);
            _libssh2_htonu32(puVar8,(uint32_t)sVar20);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
            pEVar2 = fingerprint_ctx;
            puVar9 = (session->remote).banner;
            sVar20 = strlen((char *)puVar9);
            EVP_DigestUpdate((EVP_MD_CTX *)pEVar2,puVar9,sVar20);
            _libssh2_htonu32(puVar8,(uint32_t)(session->local).kexinit_len);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(session->local).kexinit,
                             (session->local).kexinit_len);
            _libssh2_htonu32(puVar8,(uint32_t)(session->remote).kexinit_len);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(session->remote).kexinit,
                             (session->remote).kexinit_len);
            _libssh2_htonu32(puVar8,session->server_hostkey_len);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                             (ulong)session->server_hostkey_len);
            sVar21 = local_38;
            _libssh2_htonu32(puVar8,(uint32_t)local_38);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,public_key,sVar21);
            _libssh2_htonu32(puVar8,(uint32_t)server_public_key_len);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,
                             (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                             CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len));
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,pkVar15->k_value,pkVar15->k_value_len);
            EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,puVar8,(uint *)0x0);
            EVP_MD_CTX_free(fingerprint_ctx);
            pLVar7 = session->hostkey;
            puVar8 = pkVar15->h_sig;
            sVar21 = pkVar15->h_sig_len;
            sVar19 = 0x40;
LAB_00117170:
            iVar3 = (*pLVar7->sig_verify)(session,puVar8,sVar21,pkVar15->h_sig_comp,sVar19,local_40)
            ;
            if (iVar3 != 0) {
              pcVar13 = "Unable to verify hostkey signature ECDH";
              iVar3 = -0xb;
              goto LAB_0011727b;
            }
          }
          else {
            if (local_5c == LIBSSH2_EC_CURVE_NISTP384) {
              pkVar15->exchange_hash = &fingerprint_ctx;
              local_40 = ppvVar1;
              _libssh2_sha384_init(&fingerprint_ctx);
              puVar9 = (session->local).banner;
              puVar8 = pkVar15->h_sig_comp;
              if (puVar9 == (uchar *)0x0) {
                _libssh2_htonu32(puVar8,0x16);
                EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
                pcVar13 = "SSH-2.0-libssh2_1.11.0";
                sVar20 = 0x16;
                pEVar18 = (EVP_MD_CTX *)fingerprint_ctx;
              }
              else {
                sVar20 = strlen((char *)puVar9);
                _libssh2_htonu32(puVar8,(int)sVar20 - 2);
                EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
                pEVar18 = (EVP_MD_CTX *)fingerprint_ctx;
                pcVar13 = (char *)(session->local).banner;
                sVar20 = strlen(pcVar13);
                sVar20 = sVar20 - 2;
              }
              EVP_DigestUpdate(pEVar18,pcVar13,sVar20);
              sVar20 = strlen((char *)(session->remote).banner);
              _libssh2_htonu32(puVar8,(uint32_t)sVar20);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
              pEVar2 = fingerprint_ctx;
              puVar9 = (session->remote).banner;
              sVar20 = strlen((char *)puVar9);
              EVP_DigestUpdate((EVP_MD_CTX *)pEVar2,puVar9,sVar20);
              _libssh2_htonu32(puVar8,(uint32_t)(session->local).kexinit_len);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(session->local).kexinit,
                               (session->local).kexinit_len);
              _libssh2_htonu32(puVar8,(uint32_t)(session->remote).kexinit_len);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(session->remote).kexinit,
                               (session->remote).kexinit_len);
              _libssh2_htonu32(puVar8,session->server_hostkey_len);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                               (ulong)session->server_hostkey_len);
              sVar21 = local_38;
              _libssh2_htonu32(puVar8,(uint32_t)local_38);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,public_key,sVar21);
              _libssh2_htonu32(puVar8,(uint32_t)server_public_key_len);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,
                               (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                               CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len)
                              );
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,pkVar15->k_value,pkVar15->k_value_len);
              EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,puVar8,(uint *)0x0);
              EVP_MD_CTX_free(fingerprint_ctx);
              pLVar7 = session->hostkey;
              puVar8 = pkVar15->h_sig;
              sVar21 = pkVar15->h_sig_len;
              sVar19 = 0x30;
              goto LAB_00117170;
            }
            if (local_5c == LIBSSH2_EC_CURVE_NISTP256) {
              pkVar15->exchange_hash = &fingerprint_ctx;
              local_40 = ppvVar1;
              _libssh2_sha256_init(&fingerprint_ctx);
              puVar9 = (session->local).banner;
              puVar8 = pkVar15->h_sig_comp;
              if (puVar9 == (uchar *)0x0) {
                _libssh2_htonu32(puVar8,0x16);
                EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
                pcVar13 = "SSH-2.0-libssh2_1.11.0";
                sVar20 = 0x16;
                pEVar18 = (EVP_MD_CTX *)fingerprint_ctx;
              }
              else {
                sVar20 = strlen((char *)puVar9);
                _libssh2_htonu32(puVar8,(int)sVar20 - 2);
                EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
                pEVar18 = (EVP_MD_CTX *)fingerprint_ctx;
                pcVar13 = (char *)(session->local).banner;
                sVar20 = strlen(pcVar13);
                sVar20 = sVar20 - 2;
              }
              EVP_DigestUpdate(pEVar18,pcVar13,sVar20);
              sVar20 = strlen((char *)(session->remote).banner);
              _libssh2_htonu32(puVar8,(uint32_t)sVar20);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
              pEVar2 = fingerprint_ctx;
              puVar9 = (session->remote).banner;
              sVar20 = strlen((char *)puVar9);
              EVP_DigestUpdate((EVP_MD_CTX *)pEVar2,puVar9,sVar20);
              _libssh2_htonu32(puVar8,(uint32_t)(session->local).kexinit_len);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(session->local).kexinit,
                               (session->local).kexinit_len);
              _libssh2_htonu32(puVar8,(uint32_t)(session->remote).kexinit_len);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(session->remote).kexinit,
                               (session->remote).kexinit_len);
              _libssh2_htonu32(puVar8,session->server_hostkey_len);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                               (ulong)session->server_hostkey_len);
              sVar21 = local_38;
              _libssh2_htonu32(puVar8,(uint32_t)local_38);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,public_key,sVar21);
              _libssh2_htonu32(puVar8,(uint32_t)server_public_key_len);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar8,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,
                               (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                               CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len)
                              );
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,pkVar15->k_value,pkVar15->k_value_len);
              EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,puVar8,(uint *)0x0);
              EVP_MD_CTX_free(fingerprint_ctx);
              pLVar7 = session->hostkey;
              puVar8 = pkVar15->h_sig;
              sVar21 = pkVar15->h_sig_len;
              sVar19 = 0x20;
              goto LAB_00117170;
            }
          }
          pkVar15->c = '\x15';
          pkVar15->state = libssh2_NB_state_sent;
switchD_001167a9_caseD_3:
          pkVar15 = local_48;
          iVar3 = _libssh2_transport_send(session,&local_48->c,1,(uchar *)0x0,0);
          if (iVar3 == -0x25) {
            return -0x25;
          }
          if (iVar3 == 0) {
            pkVar15->state = libssh2_NB_state_sent2;
switchD_001167a9_caseD_5:
            pkVar15 = local_48;
            data_00 = &local_48->tmp;
            iVar3 = _libssh2_packet_require
                              (session,'\x15',data_00,&local_48->tmp_len,0,(uchar *)0x0,0,
                               &local_48->req_state);
            if (iVar3 == -0x25) {
              return -0x25;
            }
            if (iVar3 == 0) {
              *(byte *)&session->state = (byte)session->state | 2;
              (*session->free)(*data_00,&session->abstract);
              if (session->session_id == (uchar *)0x0) {
                if (local_5c == LIBSSH2_EC_CURVE_NISTP256) {
                  sVar21 = 0x20;
                }
                else if (local_5c == LIBSSH2_EC_CURVE_NISTP521) {
                  sVar21 = 0x40;
                }
                else {
                  if (local_5c != LIBSSH2_EC_CURVE_NISTP384) {
                    pcVar13 = "Unknown SHA digest for EC curve";
                    goto LAB_00117544;
                  }
                  sVar21 = 0x30;
                }
                puVar8 = (uchar *)(*session->alloc)(sVar21,&session->abstract);
                session->session_id = puVar8;
                if (puVar8 == (uchar *)0x0) {
                  pcVar13 = "Unable to allocate buffer for SHA digest";
                  goto LAB_001167ff;
                }
                memcpy(puVar8,pkVar15->h_sig_comp,sVar21);
                session->session_id_len = (uint32_t)sVar21;
              }
              pLVar10 = (session->local).crypt;
              if (pLVar10->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                (*pLVar10->dtor)(session,&(session->local).crypt_abstract);
                pLVar10 = (session->local).crypt;
              }
              if (pLVar10->init ==
                  (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
                   *)0x0) {
LAB_00117976:
                pLVar10 = (session->remote).crypt;
                if (pLVar10->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                  (*pLVar10->dtor)(session,&(session->remote).crypt_abstract);
                  pLVar10 = (session->remote).crypt;
                }
                if (pLVar10->init ==
                    (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
                     *)0x0) {
LAB_00117fbe:
                  p_Var11 = (session->local).mac;
                  if (p_Var11->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                    (*p_Var11->dtor)(session,&(session->local).mac_abstract);
                    p_Var11 = (session->local).mac;
                  }
                  if (p_Var11->init !=
                      (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
                    server_public_key._0_4_ = 0;
                    if (local_5c == LIBSSH2_EC_CURVE_NISTP521) {
                      puVar8 = (uchar *)(*session->alloc)((long)p_Var11->key_len + 0x40,
                                                          &session->abstract);
                      if ((puVar8 != (uchar *)0x0) && (((session->local).mac)->key_len != 0)) {
                        sVar20 = 0;
                        do {
                          _libssh2_sha512_init(&hash);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->k_value,pkVar15->k_value_len)
                          ;
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->h_sig_comp,0x40);
                          uVar14 = sVar20;
                          puVar9 = puVar8;
                          if (sVar20 == 0) {
                            EVP_DigestUpdate((EVP_MD_CTX *)hash,"E",1);
                            uVar14 = (ulong)session->session_id_len;
                            puVar9 = session->session_id;
                          }
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar9,uVar14);
                          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar8 + sVar20,(uint *)0x0);
                          EVP_MD_CTX_free(hash);
                          sVar20 = sVar20 + 0x40;
                        } while (sVar20 < (ulong)(long)((session->local).mac)->key_len);
                      }
                    }
                    else if (local_5c == LIBSSH2_EC_CURVE_NISTP384) {
                      puVar8 = (uchar *)(*session->alloc)((long)p_Var11->key_len + 0x30,
                                                          &session->abstract);
                      if ((puVar8 != (uchar *)0x0) && (((session->local).mac)->key_len != 0)) {
                        sVar20 = 0;
                        do {
                          _libssh2_sha384_init(&hash);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->k_value,pkVar15->k_value_len)
                          ;
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->h_sig_comp,0x30);
                          uVar14 = sVar20;
                          puVar9 = puVar8;
                          if (sVar20 == 0) {
                            EVP_DigestUpdate((EVP_MD_CTX *)hash,"E",1);
                            uVar14 = (ulong)session->session_id_len;
                            puVar9 = session->session_id;
                          }
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar9,uVar14);
                          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar8 + sVar20,(uint *)0x0);
                          EVP_MD_CTX_free(hash);
                          sVar20 = sVar20 + 0x30;
                        } while (sVar20 < (ulong)(long)((session->local).mac)->key_len);
                      }
                    }
                    else {
                      if (local_5c != LIBSSH2_EC_CURVE_NISTP256) goto LAB_00117f6d;
                      puVar8 = (uchar *)(*session->alloc)((long)p_Var11->key_len + 0x20,
                                                          &session->abstract);
                      if ((puVar8 != (uchar *)0x0) && (((session->local).mac)->key_len != 0)) {
                        sVar20 = 0;
                        do {
                          _libssh2_sha256_init(&hash);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->k_value,pkVar15->k_value_len)
                          ;
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->h_sig_comp,0x20);
                          uVar14 = sVar20;
                          puVar9 = puVar8;
                          if (sVar20 == 0) {
                            EVP_DigestUpdate((EVP_MD_CTX *)hash,"E",1);
                            uVar14 = (ulong)session->session_id_len;
                            puVar9 = session->session_id;
                          }
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar9,uVar14);
                          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar8 + sVar20,(uint *)0x0);
                          EVP_MD_CTX_free(hash);
                          sVar20 = sVar20 + 0x20;
                        } while (sVar20 < (ulong)(long)((session->local).mac)->key_len);
                      }
                    }
                    if (puVar8 == (uchar *)0x0) goto LAB_00117f6d;
                    (*((session->local).mac)->init)
                              (session,puVar8,(int *)&server_public_key,
                               &(session->local).mac_abstract);
                    if ((int)server_public_key != 0) {
                      explicit_bzero(puVar8,(long)((session->local).mac)->key_len);
                      (*session->free)(puVar8,&session->abstract);
                    }
                  }
                  p_Var11 = (session->remote).mac;
                  if (p_Var11->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                    (*p_Var11->dtor)(session,&(session->remote).mac_abstract);
                    p_Var11 = (session->remote).mac;
                  }
                  if (p_Var11->init !=
                      (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
                    server_public_key._0_4_ = 0;
                    if (local_5c == LIBSSH2_EC_CURVE_NISTP521) {
                      puVar8 = (uchar *)(*session->alloc)((long)p_Var11->key_len + 0x40,
                                                          &session->abstract);
                      if ((puVar8 != (uchar *)0x0) && (((session->remote).mac)->key_len != 0)) {
                        puVar9 = local_48->h_sig_comp;
                        sVar20 = 0;
                        do {
                          _libssh2_sha512_init(&hash);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,local_48->k_value,
                                           local_48->k_value_len);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar9,0x40);
                          uVar14 = sVar20;
                          puVar17 = puVar8;
                          if (sVar20 == 0) {
                            EVP_DigestUpdate((EVP_MD_CTX *)hash,"F",1);
                            uVar14 = (ulong)session->session_id_len;
                            puVar17 = session->session_id;
                          }
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar17,uVar14);
                          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar8 + sVar20,(uint *)0x0);
                          EVP_MD_CTX_free(hash);
                          sVar20 = sVar20 + 0x40;
                        } while (sVar20 < (ulong)(long)((session->remote).mac)->key_len);
                      }
                    }
                    else if (local_5c == LIBSSH2_EC_CURVE_NISTP384) {
                      puVar8 = (uchar *)(*session->alloc)((long)p_Var11->key_len + 0x30,
                                                          &session->abstract);
                      if ((puVar8 != (uchar *)0x0) && (((session->remote).mac)->key_len != 0)) {
                        puVar9 = local_48->h_sig_comp;
                        sVar20 = 0;
                        do {
                          _libssh2_sha384_init(&hash);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,local_48->k_value,
                                           local_48->k_value_len);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar9,0x30);
                          uVar14 = sVar20;
                          puVar17 = puVar8;
                          if (sVar20 == 0) {
                            EVP_DigestUpdate((EVP_MD_CTX *)hash,"F",1);
                            uVar14 = (ulong)session->session_id_len;
                            puVar17 = session->session_id;
                          }
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar17,uVar14);
                          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar8 + sVar20,(uint *)0x0);
                          EVP_MD_CTX_free(hash);
                          sVar20 = sVar20 + 0x30;
                        } while (sVar20 < (ulong)(long)((session->remote).mac)->key_len);
                      }
                    }
                    else {
                      if (local_5c != LIBSSH2_EC_CURVE_NISTP256) goto LAB_00117f6d;
                      puVar8 = (uchar *)(*session->alloc)((long)p_Var11->key_len + 0x20,
                                                          &session->abstract);
                      if ((puVar8 != (uchar *)0x0) && (((session->remote).mac)->key_len != 0)) {
                        puVar9 = local_48->h_sig_comp;
                        sVar20 = 0;
                        do {
                          _libssh2_sha256_init(&hash);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,local_48->k_value,
                                           local_48->k_value_len);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar9,0x20);
                          uVar14 = sVar20;
                          puVar17 = puVar8;
                          if (sVar20 == 0) {
                            EVP_DigestUpdate((EVP_MD_CTX *)hash,"F",1);
                            uVar14 = (ulong)session->session_id_len;
                            puVar17 = session->session_id;
                          }
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar17,uVar14);
                          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar8 + sVar20,(uint *)0x0);
                          EVP_MD_CTX_free(hash);
                          sVar20 = sVar20 + 0x20;
                        } while (sVar20 < (ulong)(long)((session->remote).mac)->key_len);
                      }
                    }
                    if (puVar8 == (uchar *)0x0) goto LAB_00117f6d;
                    (*((session->remote).mac)->init)
                              (session,puVar8,(int *)&server_public_key,
                               &(session->remote).mac_abstract);
                    if ((int)server_public_key != 0) {
                      explicit_bzero(puVar8,(long)((session->remote).mac)->key_len);
                      (*session->free)(puVar8,&session->abstract);
                    }
                  }
                  pLVar12 = (session->local).comp;
                  if (pLVar12 != (LIBSSH2_COMP_METHOD *)0x0) {
                    if (pLVar12->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                      (*pLVar12->dtor)(session,1,&(session->local).comp_abstract);
                      pLVar12 = (session->local).comp;
                      if (pLVar12 == (LIBSSH2_COMP_METHOD *)0x0) goto LAB_001186a1;
                    }
                    if (pLVar12->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                      iVar5 = (*pLVar12->init)(session,1,&(session->local).comp_abstract);
                      iVar3 = -5;
                      if (iVar5 != 0) goto switchD_001167a9_caseD_1;
                    }
                  }
LAB_001186a1:
                  pLVar12 = (session->remote).comp;
                  iVar3 = 0;
                  if (pLVar12 != (LIBSSH2_COMP_METHOD *)0x0) {
                    if (pLVar12->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                      iVar3 = 0;
                      (*pLVar12->dtor)(session,0,&(session->remote).comp_abstract);
                      pLVar12 = (session->remote).comp;
                      if (pLVar12 == (LIBSSH2_COMP_METHOD *)0x0) goto switchD_001167a9_caseD_1;
                    }
                    iVar3 = 0;
                    if (pLVar12->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                      iVar3 = (*pLVar12->init)(session,0,&(session->remote).comp_abstract);
                      iVar3 = (uint)(iVar3 == 0) * 5 + -5;
                    }
                  }
                  goto switchD_001167a9_caseD_1;
                }
                server_public_key._0_4_ = 0;
                server_public_key_len._0_4_ = 0;
                if (local_5c == LIBSSH2_EC_CURVE_NISTP256) {
                  puVar8 = (uchar *)(*session->alloc)((long)pLVar10->iv_len + 0x20,
                                                      &session->abstract);
                  if ((puVar8 != (uchar *)0x0) && (((session->remote).crypt)->iv_len != 0)) {
                    sVar20 = 0;
                    do {
                      _libssh2_sha256_init(&hash);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->k_value,pkVar15->k_value_len);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->h_sig_comp,0x20);
                      uVar14 = sVar20;
                      puVar9 = puVar8;
                      if (sVar20 == 0) {
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,"B",1);
                        uVar14 = (ulong)session->session_id_len;
                        puVar9 = session->session_id;
                      }
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar9,uVar14);
                      EVP_DigestFinal((EVP_MD_CTX *)hash,puVar8 + sVar20,(uint *)0x0);
                      EVP_MD_CTX_free(hash);
                      sVar20 = sVar20 + 0x20;
                    } while (sVar20 < (ulong)(long)((session->remote).crypt)->iv_len);
                  }
LAB_00117c5f:
                  if (puVar8 != (uchar *)0x0) {
                    if (local_5c == LIBSSH2_EC_CURVE_NISTP256) {
                      puVar9 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->
                                                                secret_len + 0x20,&session->abstract
                                                         );
                      if ((puVar9 != (uchar *)0x0) && (((session->remote).crypt)->secret_len != 0))
                      {
                        sVar20 = 0;
                        do {
                          _libssh2_sha256_init(&hash);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->k_value,pkVar15->k_value_len)
                          ;
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->h_sig_comp,0x20);
                          uVar14 = sVar20;
                          puVar17 = puVar9;
                          if (sVar20 == 0) {
                            EVP_DigestUpdate((EVP_MD_CTX *)hash,"D",1);
                            uVar14 = (ulong)session->session_id_len;
                            puVar17 = session->session_id;
                          }
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar17,uVar14);
                          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar9 + sVar20,(uint *)0x0);
                          EVP_MD_CTX_free(hash);
                          sVar20 = sVar20 + 0x20;
                        } while (sVar20 < (ulong)(long)((session->remote).crypt)->secret_len);
                      }
                    }
                    else if (local_5c == LIBSSH2_EC_CURVE_NISTP521) {
                      puVar9 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->
                                                                secret_len + 0x40,&session->abstract
                                                         );
                      if ((puVar9 != (uchar *)0x0) && (((session->remote).crypt)->secret_len != 0))
                      {
                        sVar20 = 0;
                        do {
                          _libssh2_sha512_init(&hash);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->k_value,pkVar15->k_value_len)
                          ;
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->h_sig_comp,0x40);
                          uVar14 = sVar20;
                          puVar17 = puVar9;
                          if (sVar20 == 0) {
                            EVP_DigestUpdate((EVP_MD_CTX *)hash,"D",1);
                            uVar14 = (ulong)session->session_id_len;
                            puVar17 = session->session_id;
                          }
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar17,uVar14);
                          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar9 + sVar20,(uint *)0x0);
                          EVP_MD_CTX_free(hash);
                          sVar20 = sVar20 + 0x40;
                        } while (sVar20 < (ulong)(long)((session->remote).crypt)->secret_len);
                      }
                    }
                    else {
                      if (local_5c != LIBSSH2_EC_CURVE_NISTP384) goto LAB_00117f64;
                      puVar9 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->
                                                                secret_len + 0x30,&session->abstract
                                                         );
                      if ((puVar9 != (uchar *)0x0) && (((session->remote).crypt)->secret_len != 0))
                      {
                        sVar20 = 0;
                        do {
                          _libssh2_sha384_init(&hash);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->k_value,pkVar15->k_value_len)
                          ;
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->h_sig_comp,0x30);
                          uVar14 = sVar20;
                          puVar17 = puVar9;
                          if (sVar20 == 0) {
                            EVP_DigestUpdate((EVP_MD_CTX *)hash,"D",1);
                            uVar14 = (ulong)session->session_id_len;
                            puVar17 = session->session_id;
                          }
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar17,uVar14);
                          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar9 + sVar20,(uint *)0x0);
                          EVP_MD_CTX_free(hash);
                          sVar20 = sVar20 + 0x30;
                        } while (sVar20 < (ulong)(long)((session->remote).crypt)->secret_len);
                      }
                    }
                    if (puVar9 == (uchar *)0x0) goto LAB_00117f64;
                    pLVar10 = (session->remote).crypt;
                    iVar3 = (*pLVar10->init)(session,pLVar10,puVar8,(int *)&server_public_key,puVar9
                                             ,(int *)&server_public_key_len,0,
                                             &(session->remote).crypt_abstract);
                    if (iVar3 != 0) goto LAB_00117f56;
                    if ((int)server_public_key != 0) {
                      explicit_bzero(puVar8,(long)((session->remote).crypt)->iv_len);
                      (*session->free)(puVar8,&session->abstract);
                    }
                    if ((uint32_t)server_public_key_len != 0) {
                      explicit_bzero(puVar9,(long)((session->remote).crypt)->secret_len);
                      (*session->free)(puVar9,&session->abstract);
                    }
                    goto LAB_00117fbe;
                  }
                }
                else {
                  if (local_5c == LIBSSH2_EC_CURVE_NISTP521) {
                    puVar8 = (uchar *)(*session->alloc)((long)pLVar10->iv_len + 0x40,
                                                        &session->abstract);
                    if ((puVar8 != (uchar *)0x0) && (((session->remote).crypt)->iv_len != 0)) {
                      sVar20 = 0;
                      do {
                        _libssh2_sha512_init(&hash);
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->k_value,pkVar15->k_value_len);
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->h_sig_comp,0x40);
                        uVar14 = sVar20;
                        puVar9 = puVar8;
                        if (sVar20 == 0) {
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,"B",1);
                          uVar14 = (ulong)session->session_id_len;
                          puVar9 = session->session_id;
                        }
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar9,uVar14);
                        EVP_DigestFinal((EVP_MD_CTX *)hash,puVar8 + sVar20,(uint *)0x0);
                        EVP_MD_CTX_free(hash);
                        sVar20 = sVar20 + 0x40;
                      } while (sVar20 < (ulong)(long)((session->remote).crypt)->iv_len);
                    }
                    goto LAB_00117c5f;
                  }
                  if (local_5c == LIBSSH2_EC_CURVE_NISTP384) {
                    puVar8 = (uchar *)(*session->alloc)((long)pLVar10->iv_len + 0x30,
                                                        &session->abstract);
                    if ((puVar8 != (uchar *)0x0) && (((session->remote).crypt)->iv_len != 0)) {
                      sVar20 = 0;
                      do {
                        _libssh2_sha384_init(&hash);
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->k_value,pkVar15->k_value_len);
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->h_sig_comp,0x30);
                        uVar14 = sVar20;
                        puVar9 = puVar8;
                        if (sVar20 == 0) {
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,"B",1);
                          uVar14 = (ulong)session->session_id_len;
                          puVar9 = session->session_id;
                        }
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar9,uVar14);
                        EVP_DigestFinal((EVP_MD_CTX *)hash,puVar8 + sVar20,(uint *)0x0);
                        EVP_MD_CTX_free(hash);
                        sVar20 = sVar20 + 0x30;
                      } while (sVar20 < (ulong)(long)((session->remote).crypt)->iv_len);
                    }
                    goto LAB_00117c5f;
                  }
                }
              }
              else {
                server_public_key._0_4_ = 0;
                server_public_key_len._0_4_ = 0;
                if (local_5c == LIBSSH2_EC_CURVE_NISTP256) {
                  puVar8 = (uchar *)(*session->alloc)((long)pLVar10->iv_len + 0x20,
                                                      &session->abstract);
                  if ((puVar8 != (uchar *)0x0) && (((session->local).crypt)->iv_len != 0)) {
                    sVar20 = 0;
                    do {
                      _libssh2_sha256_init(&hash);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->k_value,pkVar15->k_value_len);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->h_sig_comp,0x20);
                      uVar14 = sVar20;
                      puVar9 = puVar8;
                      if (sVar20 == 0) {
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,"A",1);
                        uVar14 = (ulong)session->session_id_len;
                        puVar9 = session->session_id;
                      }
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar9,uVar14);
                      EVP_DigestFinal((EVP_MD_CTX *)hash,puVar8 + sVar20,(uint *)0x0);
                      EVP_MD_CTX_free(hash);
                      sVar20 = sVar20 + 0x20;
                    } while (sVar20 < (ulong)(long)((session->local).crypt)->iv_len);
                  }
                }
                else if (local_5c == LIBSSH2_EC_CURVE_NISTP521) {
                  puVar8 = (uchar *)(*session->alloc)((long)pLVar10->iv_len + 0x40,
                                                      &session->abstract);
                  if ((puVar8 != (uchar *)0x0) && (((session->local).crypt)->iv_len != 0)) {
                    sVar20 = 0;
                    do {
                      _libssh2_sha512_init(&hash);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->k_value,pkVar15->k_value_len);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->h_sig_comp,0x40);
                      uVar14 = sVar20;
                      puVar9 = puVar8;
                      if (sVar20 == 0) {
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,"A",1);
                        uVar14 = (ulong)session->session_id_len;
                        puVar9 = session->session_id;
                      }
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar9,uVar14);
                      EVP_DigestFinal((EVP_MD_CTX *)hash,puVar8 + sVar20,(uint *)0x0);
                      EVP_MD_CTX_free(hash);
                      sVar20 = sVar20 + 0x40;
                    } while (sVar20 < (ulong)(long)((session->local).crypt)->iv_len);
                  }
                }
                else {
                  iVar3 = -1;
                  if (local_5c != LIBSSH2_EC_CURVE_NISTP384) goto switchD_001167a9_caseD_1;
                  puVar8 = (uchar *)(*session->alloc)((long)pLVar10->iv_len + 0x30,
                                                      &session->abstract);
                  pkVar15 = local_48;
                  if ((puVar8 != (uchar *)0x0) && (((session->local).crypt)->iv_len != 0)) {
                    puVar9 = local_48->h_sig_comp;
                    sVar20 = 0;
                    do {
                      _libssh2_sha384_init(&hash);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->k_value,pkVar15->k_value_len);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar9,0x30);
                      uVar14 = sVar20;
                      puVar17 = puVar8;
                      if (sVar20 == 0) {
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,"A",1);
                        uVar14 = (ulong)session->session_id_len;
                        puVar17 = session->session_id;
                      }
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar17,uVar14);
                      EVP_DigestFinal((EVP_MD_CTX *)hash,puVar8 + sVar20,(uint *)0x0);
                      EVP_MD_CTX_free(hash);
                      sVar20 = sVar20 + 0x30;
                    } while (sVar20 < (ulong)(long)((session->local).crypt)->iv_len);
                  }
                }
                if (puVar8 == (uchar *)0x0) {
                  iVar3 = -1;
                  goto switchD_001167a9_caseD_1;
                }
                if (local_5c == LIBSSH2_EC_CURVE_NISTP256) {
                  puVar9 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len +
                                                      0x20,&session->abstract);
                  if ((puVar9 != (uchar *)0x0) && (((session->local).crypt)->secret_len != 0)) {
                    sVar20 = 0;
                    do {
                      _libssh2_sha256_init(&hash);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->k_value,pkVar15->k_value_len);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->h_sig_comp,0x20);
                      uVar14 = sVar20;
                      puVar17 = puVar9;
                      if (sVar20 == 0) {
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,"C",1);
                        uVar14 = (ulong)session->session_id_len;
                        puVar17 = session->session_id;
                      }
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar17,uVar14);
                      EVP_DigestFinal((EVP_MD_CTX *)hash,puVar9 + sVar20,(uint *)0x0);
                      EVP_MD_CTX_free(hash);
                      sVar20 = sVar20 + 0x20;
                    } while (sVar20 < (ulong)(long)((session->local).crypt)->secret_len);
                  }
LAB_001178f4:
                  if (puVar9 != (uchar *)0x0) {
                    pLVar10 = (session->local).crypt;
                    iVar3 = (*pLVar10->init)(session,pLVar10,puVar8,(int *)&server_public_key,puVar9
                                             ,(int *)&server_public_key_len,1,
                                             &(session->local).crypt_abstract);
                    if (iVar3 == 0) {
                      if ((int)server_public_key != 0) {
                        explicit_bzero(puVar8,(long)((session->local).crypt)->iv_len);
                        (*session->free)(puVar8,&session->abstract);
                      }
                      if ((uint32_t)server_public_key_len != 0) {
                        explicit_bzero(puVar9,(long)((session->local).crypt)->secret_len);
                        (*session->free)(puVar9,&session->abstract);
                      }
                      goto LAB_00117976;
                    }
LAB_00117f56:
                    (*session->free)(puVar8,&session->abstract);
                    puVar8 = puVar9;
                  }
                }
                else {
                  if (local_5c == LIBSSH2_EC_CURVE_NISTP521) {
                    puVar9 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len +
                                                        0x40,&session->abstract);
                    if ((puVar9 != (uchar *)0x0) && (((session->local).crypt)->secret_len != 0)) {
                      sVar20 = 0;
                      do {
                        _libssh2_sha512_init(&hash);
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->k_value,pkVar15->k_value_len);
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->h_sig_comp,0x40);
                        uVar14 = sVar20;
                        puVar17 = puVar9;
                        if (sVar20 == 0) {
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,"C",1);
                          uVar14 = (ulong)session->session_id_len;
                          puVar17 = session->session_id;
                        }
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar17,uVar14);
                        EVP_DigestFinal((EVP_MD_CTX *)hash,puVar9 + sVar20,(uint *)0x0);
                        EVP_MD_CTX_free(hash);
                        sVar20 = sVar20 + 0x40;
                      } while (sVar20 < (ulong)(long)((session->local).crypt)->secret_len);
                    }
                    goto LAB_001178f4;
                  }
                  if (local_5c == LIBSSH2_EC_CURVE_NISTP384) {
                    puVar9 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len +
                                                        0x30,&session->abstract);
                    if ((puVar9 != (uchar *)0x0) && (((session->local).crypt)->secret_len != 0)) {
                      sVar20 = 0;
                      do {
                        _libssh2_sha384_init(&hash);
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->k_value,pkVar15->k_value_len);
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,pkVar15->h_sig_comp,0x30);
                        uVar14 = sVar20;
                        puVar17 = puVar9;
                        if (sVar20 == 0) {
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,"C",1);
                          uVar14 = (ulong)session->session_id_len;
                          puVar17 = session->session_id;
                        }
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar17,uVar14);
                        EVP_DigestFinal((EVP_MD_CTX *)hash,puVar9 + sVar20,(uint *)0x0);
                        EVP_MD_CTX_free(hash);
                        sVar20 = sVar20 + 0x30;
                      } while (sVar20 < (ulong)(long)((session->local).crypt)->secret_len);
                    }
                    goto LAB_001178f4;
                  }
                }
LAB_00117f64:
                (*session->free)(puVar8,&session->abstract);
              }
LAB_00117f6d:
              iVar3 = -5;
              goto switchD_001167a9_caseD_1;
            }
            pcVar13 = "Timed out waiting for NEWKEYS ECDH";
          }
          else {
            pcVar13 = "Unable to send NEWKEYS message ECDH";
          }
        }
        else {
          pcVar13 = "Unable to create ECDH shared secret";
LAB_00117544:
          iVar3 = -5;
        }
      }
      else {
        pcVar13 = "Unexpected key length ECDH";
        iVar3 = -0xe;
      }
    }
    else {
      pcVar13 = "Unable to initialize hostkey importer ECDH";
LAB_0011693a:
      iVar3 = -10;
    }
  }
  else {
    pcVar13 = "Unable to allocate memory for a copy of the host ECDH key";
LAB_001167ff:
    iVar3 = -6;
  }
LAB_0011727b:
  iVar3 = _libssh2_error(session,iVar3,pcVar13);
switchD_001167a9_caseD_1:
  pkVar15 = local_48;
  BN_clear_free((BIGNUM *)local_48->k);
  pkVar15->k = (BIGNUM *)0x0;
  if (pkVar15->k_value != (uchar *)0x0) {
    (*session->free)(pkVar15->k_value,&session->abstract);
    pkVar15->k_value = (uchar *)0x0;
  }
  pkVar15->state = libssh2_NB_state_idle;
  return iVar3;
}

Assistant:

static int ecdh_sha2_nistp(LIBSSH2_SESSION *session, libssh2_curve_type type,
                           unsigned char *data, size_t data_len,
                           unsigned char *public_key,
                           size_t public_key_len, _libssh2_ec_key *private_key,
                           kmdhgGPshakex_state_t *exchange_state)
{
    int ret = 0;
    int rc;

    if(data_len < 5) {
        ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                             "Host key data is too short");
        return ret;
    }

    if(exchange_state->state == libssh2_NB_state_idle) {

        /* Setup initial values */
        exchange_state->k = _libssh2_bn_init();

        exchange_state->state = libssh2_NB_state_created;
    }

    if(exchange_state->state == libssh2_NB_state_created) {
        /* parse INIT reply data */

        /* host key K_S */
        unsigned char *server_public_key;
        size_t server_public_key_len;
        struct string_buf buf;

        buf.data = data;
        buf.len = data_len;
        buf.dataptr = buf.data;
        buf.dataptr++; /* Advance past packet type */

        if(_libssh2_copy_string(session, &buf, &(session->server_hostkey),
                                &server_public_key_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate memory for a copy "
                                 "of the host ECDH key");
            goto clean_exit;
        }

        session->server_hostkey_len = (uint32_t)server_public_key_len;

#if LIBSSH2_MD5
        {
            libssh2_md5_ctx fingerprint_ctx;

            if(libssh2_md5_init(&fingerprint_ctx)) {
                libssh2_md5_update(fingerprint_ctx, session->server_hostkey,
                                   session->server_hostkey_len);
                libssh2_md5_final(fingerprint_ctx,
                                  session->server_hostkey_md5);
                session->server_hostkey_md5_valid = TRUE;
            }
            else {
                session->server_hostkey_md5_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[50], *fprint = fingerprint;
            int i;
            for(i = 0; i < 16; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_md5[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's MD5 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */
#endif /* ! LIBSSH2_MD5 */

        {
            libssh2_sha1_ctx fingerprint_ctx;

            if(libssh2_sha1_init(&fingerprint_ctx)) {
                libssh2_sha1_update(fingerprint_ctx, session->server_hostkey,
                                    session->server_hostkey_len);
                libssh2_sha1_final(fingerprint_ctx,
                                   session->server_hostkey_sha1);
                session->server_hostkey_sha1_valid = TRUE;
            }
            else {
                session->server_hostkey_sha1_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[64], *fprint = fingerprint;
            int i;
            for(i = 0; i < 20; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_sha1[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's SHA1 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */

        /* SHA256 */
        {
            libssh2_sha256_ctx fingerprint_ctx;

            if(libssh2_sha256_init(&fingerprint_ctx)) {
                libssh2_sha256_update(fingerprint_ctx, session->server_hostkey,
                                      session->server_hostkey_len);
                libssh2_sha256_final(fingerprint_ctx,
                                     session->server_hostkey_sha256);
                session->server_hostkey_sha256_valid = TRUE;
            }
            else {
                session->server_hostkey_sha256_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char *base64Fingerprint = NULL;
            _libssh2_base64_encode(session,
                                   (const char *)
                                   session->server_hostkey_sha256,
                                   SHA256_DIGEST_LENGTH, &base64Fingerprint);
            if(base64Fingerprint) {
                _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                               "Server's SHA256 Fingerprint: %s",
                               base64Fingerprint));
                LIBSSH2_FREE(session, base64Fingerprint);
            }
        }
#endif /* LIBSSH2DEBUG */

        if(session->hostkey->init(session, session->server_hostkey,
                                  session->server_hostkey_len,
                                  &session->server_hostkey_abstract)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unable to initialize hostkey importer "
                                 "ECDH");
            goto clean_exit;
        }

        /* server public key Q_S */
        if(_libssh2_get_string(&buf, &server_public_key,
                               &server_public_key_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected key length ECDH");
            goto clean_exit;
        }

        /* server signature */
        if(_libssh2_get_string(&buf, &exchange_state->h_sig,
           &(exchange_state->h_sig_len))) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unexpected ECDH server sig length");
            goto clean_exit;
        }

        /* Compute the shared secret K */
        rc = _libssh2_ecdh_gen_k(&exchange_state->k, private_key,
                                 server_public_key, server_public_key_len);
        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_KEX_FAILURE,
                                 "Unable to create ECDH shared secret");
            goto clean_exit;
        }

        exchange_state->k_value_len = _libssh2_bn_bytes(exchange_state->k) + 5;
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            /* don't need leading 00 */
            exchange_state->k_value_len--;
        }
        exchange_state->k_value =
        LIBSSH2_ALLOC(session, exchange_state->k_value_len);
        if(!exchange_state->k_value) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate buffer for ECDH K");
            goto clean_exit;
        }
        _libssh2_htonu32(exchange_state->k_value,
                         (uint32_t)(exchange_state->k_value_len - 4));
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 4);
        }
        else {
            exchange_state->k_value[4] = 0;
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 5);
        }

        /* verify hash */

        switch(type) {
            case LIBSSH2_EC_CURVE_NISTP256:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(256);
                break;

            case LIBSSH2_EC_CURVE_NISTP384:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(384);
                break;
            case LIBSSH2_EC_CURVE_NISTP521:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(512);
                break;
        }

        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_SIGN,
                                 "Unable to verify hostkey signature "
                                 "ECDH");
            goto clean_exit;
        }

        exchange_state->c = SSH_MSG_NEWKEYS;
        exchange_state->state = libssh2_NB_state_sent;
    }

    if(exchange_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, &exchange_state->c, 1, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send NEWKEYS message ECDH");
            goto clean_exit;
        }

        exchange_state->state = libssh2_NB_state_sent2;
    }

    if(exchange_state->state == libssh2_NB_state_sent2) {
        rc = _libssh2_packet_require(session, SSH_MSG_NEWKEYS,
                                     &exchange_state->tmp,
                                     &exchange_state->tmp_len, 0, NULL, 0,
                                     &exchange_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timed out waiting for NEWKEYS ECDH");
            goto clean_exit;
        }

        /* The first key exchange has been performed,
           switch to active crypt/comp/mac mode */
        session->state |= LIBSSH2_STATE_NEWKEYS;
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Received NEWKEYS message ECDH"));

        /* This will actually end up being just packet_type(1)
           for this packet type anyway */
        LIBSSH2_FREE(session, exchange_state->tmp);

        if(!session->session_id) {

            size_t digest_length = 0;

            if(type == LIBSSH2_EC_CURVE_NISTP256)
                digest_length = SHA256_DIGEST_LENGTH;
            else if(type == LIBSSH2_EC_CURVE_NISTP384)
                digest_length = SHA384_DIGEST_LENGTH;
            else if(type == LIBSSH2_EC_CURVE_NISTP521)
                digest_length = SHA512_DIGEST_LENGTH;
            else{
                ret = _libssh2_error(session, LIBSSH2_ERROR_KEX_FAILURE,
                                     "Unknown SHA digest for EC curve");
                goto clean_exit;

            }
            session->session_id = LIBSSH2_ALLOC(session, digest_length);
            if(!session->session_id) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                     "Unable to allocate buffer for "
                                     "SHA digest");
                goto clean_exit;
            }
            memcpy(session->session_id, exchange_state->h_sig_comp,
                   digest_length);
             session->session_id_len = (uint32_t)digest_length;
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "session_id calculated"));
        }

        /* Cleanup any existing cipher */
        if(session->local.crypt->dtor) {
            session->local.crypt->dtor(session,
                                       &session->local.crypt_abstract);
        }

        /* Calculate IV/Secret/Key for each direction */
        if(session->local.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(iv,
                                                 session->local.crypt->
                                                 iv_len, "A");
            if(!iv) {
                ret = -1;
                goto clean_exit;
            }

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(secret,
                                                 session->local.crypt->
                                                 secret_len, "C");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->local.crypt->
                init(session, session->local.crypt, iv, &free_iv, secret,
                     &free_secret, 1, &session->local.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->local.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->local.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server IV and Key calculated"));

        if(session->remote.crypt->dtor) {
            /* Cleanup any existing cipher */
            session->remote.crypt->dtor(session,
                                        &session->remote.crypt_abstract);
        }

        if(session->remote.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(iv,
                                                 session->remote.crypt->
                                                 iv_len, "B");

            if(!iv) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(secret,
                                                 session->remote.crypt->
                                                 secret_len, "D");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->remote.crypt->
                init(session, session->remote.crypt, iv, &free_iv, secret,
                     &free_secret, 0, &session->remote.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->remote.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->remote.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client IV and Key calculated"));

        if(session->local.mac->dtor) {
            session->local.mac->dtor(session, &session->local.mac_abstract);
        }

        if(session->local.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(key,
                                                 session->local.mac->
                                                 key_len, "E");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->local.mac->init(session, key, &free_key,
                                     &session->local.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->local.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server HMAC Key calculated"));

        if(session->remote.mac->dtor) {
            session->remote.mac->dtor(session, &session->remote.mac_abstract);
        }

        if(session->remote.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(key,
                                                 session->remote.mac->
                                                 key_len, "F");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->remote.mac->init(session, key, &free_key,
                                      &session->remote.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->remote.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client HMAC Key calculated"));

        /* Initialize compression for each direction */

        /* Cleanup any existing compression */
        if(session->local.comp && session->local.comp->dtor) {
            session->local.comp->dtor(session, 1,
                                      &session->local.comp_abstract);
        }

        if(session->local.comp && session->local.comp->init) {
            if(session->local.comp->init(session, 1,
                                         &session->local.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server compression initialized"));

        if(session->remote.comp && session->remote.comp->dtor) {
            session->remote.comp->dtor(session, 0,
                                       &session->remote.comp_abstract);
        }

        if(session->remote.comp && session->remote.comp->init) {
            if(session->remote.comp->init(session, 0,
                                          &session->remote.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client compression initialized"));
    }

clean_exit:
    _libssh2_bn_free(exchange_state->k);
    exchange_state->k = NULL;

    if(exchange_state->k_value) {
        LIBSSH2_FREE(session, exchange_state->k_value);
        exchange_state->k_value = NULL;
    }

    exchange_state->state = libssh2_NB_state_idle;

    return ret;
}